

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O3

TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_> * __thiscall
BurstSimple<unsigned_short>::operator()
          (BurstSimple<unsigned_short> *this,vector_bagwell<unsigned_char_*,_16U> *bucket,
          size_t depth)

{
  pointer pppuVar1;
  ushort uVar2;
  TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_> *this_00;
  ulong uVar3;
  uchar *puVar4;
  vector_bagwell<unsigned_char_*,_16U> *pvVar5;
  ulong uVar6;
  uint uVar7;
  uint j;
  long lVar8;
  uchar **t;
  size_t index;
  array<unsigned_short,_64UL> cache;
  array<unsigned_char_*,_64UL> strings;
  ushort auStack_2b0 [64];
  uchar *local_230 [64];
  
  this_00 = (TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_> *)operator_new(0x18);
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (bucket->_insertpos != (uchar **)0x0) {
    pppuVar1 = (bucket->_index_block).
               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
    uVar3 = (ulong)((long)bucket->_insertpos +
                   ((long)((1 << ((char)((uint)((int)pppuVar1 -
                                               *(int *)&(bucket->_index_block).
                                                                                                                
                                                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                                  3U & 0x1f)) + -0x10) * 8 - (long)pppuVar1[-1])) >> 3;
    uVar6 = 0;
    uVar7 = (uint)uVar3;
    if (0x3f < uVar7) {
      uVar6 = 0;
      do {
        lVar8 = 0;
        do {
          puVar4 = vector_bagwell<unsigned_char_*,_16U>::operator[](bucket,lVar8 + uVar6);
          local_230[lVar8] = puVar4;
          if (puVar4 == (uchar *)0x0) goto LAB_001ad4dc;
          if (puVar4[depth] == '\0') {
            uVar2 = 0;
          }
          else {
            uVar2 = CONCAT11(puVar4[depth],puVar4[depth + 1]);
          }
          auStack_2b0[lVar8] = uVar2;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x40);
        t = local_230;
        lVar8 = 0;
        do {
          pvVar5 = TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_>::get_bucket
                             (this_00,(uint)auStack_2b0[lVar8]);
          if (pvVar5 == (vector_bagwell<unsigned_char_*,_16U> *)0x0) {
            __assert_fail("sub_bucket",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                          ,0x78,
                          "TrieNode<CharT, BucketT> *BurstSimple<unsigned short>::operator()(const BucketT &, size_t) const [CharT = unsigned short, BucketT = vector_bagwell<unsigned char *>]"
                         );
          }
          vector_bagwell<unsigned_char_*,_16U>::push_back(pvVar5,t);
          lVar8 = lVar8 + 1;
          t = t + 1;
        } while (lVar8 != 0x40);
        uVar6 = uVar6 + 0x40;
      } while (uVar6 < (uVar7 & 0xffffffc0));
    }
    if ((uint)uVar6 < uVar7) {
      index = uVar6 & 0xffffffff;
      do {
        local_230[0] = vector_bagwell<unsigned_char_*,_16U>::operator[](bucket,index);
        if (local_230[0] == (uchar *)0x0) {
LAB_001ad4dc:
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                        ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
        }
        if (local_230[0][depth] == '\0') {
          uVar7 = 0;
        }
        else {
          uVar7 = (uint)CONCAT11(local_230[0][depth],local_230[0][depth + 1]);
        }
        pvVar5 = TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_>::get_bucket
                           (this_00,uVar7);
        if (pvVar5 == (vector_bagwell<unsigned_char_*,_16U> *)0x0) {
          __assert_fail("sub_bucket",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                        ,0x80,
                        "TrieNode<CharT, BucketT> *BurstSimple<unsigned short>::operator()(const BucketT &, size_t) const [CharT = unsigned short, BucketT = vector_bagwell<unsigned char *>]"
                       );
        }
        vector_bagwell<unsigned_char_*,_16U>::push_back(pvVar5,local_230);
        index = index + 1;
      } while ((uVar3 & 0xffffffff) != index);
    }
  }
  return this_00;
}

Assistant:

TrieNode<CharT, BucketT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT, BucketT>* new_node = new TrieNode<CharT, BucketT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			std::array<CharT, 64> cache;
			std::array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = new_node->get_bucket(ch);
				assert(sub_bucket);
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = new_node->get_bucket(ch);
			assert(sub_bucket);
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}